

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phone.cpp
# Opt level: O1

void __thiscall state_machine::Phone::Phone(Phone *this)

{
  _Rb_tree_header *p_Var1;
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  *pvVar2;
  key_type local_24;
  undefined8 local_20;
  undefined8 uStack_18;
  
  p_Var1 = &(this->m_rules)._M_t._M_impl.super__Rb_tree_header;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_current_state = on_hook;
  local_20 = 0;
  local_24 = on_hook;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_24);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_20,&uStack_18);
  local_20 = 0x100000001;
  uStack_18 = 0x800000005;
  local_24 = off_hook;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_24);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_20,&stack0xfffffffffffffff0);
  local_20 = 0x200000002;
  uStack_18 = 0x800000005;
  local_24 = dialing;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_24);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_20,&stack0xfffffffffffffff0);
  local_20 = 0x500000003;
  uStack_18 = 0x600000005;
  local_24 = connected;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_24);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_20,&stack0xfffffffffffffff0);
  local_20 = 0x400000004;
  uStack_18 = 0x600000005;
  local_24 = on_hold;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_24);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_20,&stack0xfffffffffffffff0);
  local_20 = 0x800000005;
  local_24 = disconnected;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_24);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_20,&uStack_18);
  return;
}

Assistant:

Phone::Phone() {
    m_rules[State::on_hook] = {
        {Action::take_off_hook, State::off_hook}};

    m_rules[State::off_hook] = {
        {Action::dialing, State::dialing},
        {Action::put_on_hook, State::on_hook}};

    m_rules[State::dialing] = {
        {Action::calling, State::connecting},
        {Action::put_on_hook, State::on_hook}};

    m_rules[State::connected] = {
        {Action::put_on_hold, State::on_hold},
        {Action::put_on_hook, State::disconnecting}};

    m_rules[State::on_hold] = {
        {Action::take_off_hold, State::connected},
        {Action::put_on_hook, State::disconnecting}};

    m_rules[State::disconnected] = {
        {Action::put_on_hook, State::on_hook}};
}